

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  LogMessage *pLVar1;
  undefined7 in_register_00000011;
  ExtensionInfo info;
  LogFinisher local_69;
  undefined1 local_68 [14];
  bool local_5a;
  anon_union_16_2_0e0aa8cc_for_ExtensionInfo_5 local_58;
  FieldDescriptor *local_48;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9c);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)local_68,
                        "CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(&local_69,pLVar1);
  }
  else if (type == '\v') {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9d);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)local_68,
                        "CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=(&local_69,pLVar1);
  }
  else {
    if (type != '\n') goto LAB_003c4cf8;
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9e);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)local_68,
                        "CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=(&local_69,pLVar1);
  }
  LogMessage::~LogMessage((LogMessage *)local_68);
LAB_003c4cf8:
  local_58.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  local_58.enum_validity_check.arg = (pointer)0x0;
  local_48 = (FieldDescriptor *)0x0;
  local_68._0_8_ = extendee;
  local_68._8_4_ = number;
  local_68[0xc] = type;
  local_68[0xd] = is_repeated;
  local_5a = is_packed;
  anon_unknown_26::Register((ExtensionInfo *)local_68);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}